

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O3

void ARKodeButcherTable_Space(ARKodeButcherTable B,sunindextype *liw,sunindextype *lrw)

{
  *liw = 0;
  *lrw = 0;
  if (B != (ARKodeButcherTable)0x0) {
    *liw = 3;
    *lrw = (long)(int)(((3 - (uint)(B->d == (sunrealtype *)0x0)) + B->stages) * B->stages);
  }
  return;
}

Assistant:

void ARKodeButcherTable_Space(ARKodeButcherTable B, sunindextype* liw,
                              sunindextype* lrw)
{
  /* initialize outputs and return if B is not allocated */
  *liw = 0;
  *lrw = 0;
  if (B == NULL) { return; }

  /* fill outputs based on B */
  *liw = 3;
  if (B->d != NULL) { *lrw = B->stages * (B->stages + 3); }
  else { *lrw = B->stages * (B->stages + 2); }
}